

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O0

void jrtplib::RTPTime::Wait(RTPTime *delay)

{
  ulong uVar1;
  undefined1 local_40 [8];
  timespec rem;
  timespec req;
  uint64_t nanosec;
  uint64_t sec;
  RTPTime *delay_local;
  
  if (0.0 < delay->m_t) {
    uVar1 = (ulong)delay->m_t;
    rem.tv_nsec = uVar1 | (long)(delay->m_t - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
    nanosleep((timespec *)&rem.tv_nsec,(timespec *)local_40);
  }
  return;
}

Assistant:

inline void RTPTime::Wait(const RTPTime &delay)
{
	if (delay.m_t <= 0)
		return;

	uint64_t sec = (uint64_t)delay.m_t;
	uint64_t nanosec = (uint32_t)(1e9*(delay.m_t-(double)sec));

	struct timespec req,rem;

	req.tv_sec = (time_t)sec;
	req.tv_nsec = ((long)nanosec);
	nanosleep(&req,&rem);
}